

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printCPSIFlag(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  char *s;
  int local_30;
  x86_reg local_2c;
  int i;
  uint IFlags;
  MCOperand *Op;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar1 = MCOperand_getImm(op);
  local_2c = (x86_reg)iVar1;
  for (local_30 = 2; -1 < local_30; local_30 = local_30 + -1) {
    if ((local_2c & 1 << ((byte)local_30 & 0x1f)) != X86_REG_INVALID) {
      s = ARM_PROC_IFlagsToString(1 << ((byte)local_30 & 0x1f));
      SStream_concat0(O,s);
    }
  }
  if (local_2c == X86_REG_INVALID) {
    SStream_concat0(O,"none");
    local_2c = X86_REG_DL;
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).x86.sib_index = local_2c;
  }
  return;
}

Assistant:

static void printCPSIFlag(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned IFlags = (unsigned int)MCOperand_getImm(Op);
	int i;

	for (i = 2; i >= 0; --i)
		if (IFlags & (1 << i)) {
			SStream_concat0(O, ARM_PROC_IFlagsToString(1 << i));
		}

	if (IFlags == 0) {
		SStream_concat0(O, "none");
		IFlags = ARM_CPSFLAG_NONE;
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.cps_flag = IFlags;
	}
}